

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_gcd.c
# Opt level: O0

void zzExGCD(word *d,word *da,word *db,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  int iVar1;
  bool_t bVar2;
  word *b_01;
  word *b_02;
  word *b_03;
  word *a_00;
  word *a_01;
  size_t sVar3;
  size_t sVar4;
  word wVar5;
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  ulong in_R8;
  word *in_R9;
  ulong in_stack_00000008;
  word *in_stack_00000010;
  word *db1;
  word *da1;
  word *v;
  word *u;
  word *bb;
  word *aa;
  size_t mv;
  size_t nu;
  size_t s;
  word *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  word *in_stack_ffffffffffffff20;
  word *in_stack_ffffffffffffff28;
  word *in_stack_ffffffffffffff30;
  ulong local_88;
  size_t local_48;
  size_t local_40;
  
  b_00 = in_stack_00000010;
  b_01 = in_stack_00000010 + in_R8;
  b_02 = b_01 + in_stack_00000008;
  b_03 = b_02 + in_R8;
  a_00 = b_03 + in_stack_00000008;
  a_01 = a_00 + in_stack_00000008;
  in_stack_00000010 = a_01 + in_R8;
  local_88 = in_R8;
  if (in_stack_00000008 <= in_R8) {
    local_88 = in_stack_00000008;
  }
  wwSetZero(in_RDI,local_88);
  wwSetW(in_RSI,in_stack_00000008,1);
  wwSetZero(in_RDX,in_R8);
  wwSetZero(a_00,in_stack_00000008);
  wwSetW(a_01,in_R8,1);
  sVar3 = wwLoZeroBits(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
  sVar4 = wwLoZeroBits(in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
  utilMin(2,sVar3,sVar4);
  wwCopy(b_00,in_RCX,in_R8);
  wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  sVar3 = wwWordSize(b_00,in_R8);
  wwCopy(b_01,in_R9,in_stack_00000008);
  wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  sVar4 = wwWordSize(b_01,in_stack_00000008);
  wwCopy(b_02,b_00,sVar3);
  wwCopy(b_03,b_01,sVar4);
  local_40 = sVar3;
  local_48 = sVar4;
  do {
    while ((*b_02 & 1) == 0) {
      if (((*in_RSI & 1) == 0) && ((*in_RDX & 1) == 0)) {
        wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10
              );
        wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10
              );
      }
      else {
        zzAdd2(in_RSI,b_01,sVar4);
        wwShLoCarry(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                    (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        zzAdd2(in_RDX,b_00,sVar3);
        wwShLoCarry(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                    (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    }
    while ((*b_03 & 1) == 0) {
      if (((*a_00 & 1) == 0) && ((*a_01 & 1) == 0)) {
        wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10
              );
        wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10
              );
      }
      else {
        in_stack_ffffffffffffff30 = a_00;
        zzAdd2(a_00,b_01,sVar4);
        wwShLoCarry(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                    (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        zzAdd2(a_01,b_00,sVar3);
        wwShLoCarry(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                    (size_t)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      wwShLo(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
    }
    local_40 = wwWordSize(b_02,local_40);
    local_48 = wwWordSize(b_03,local_48);
    iVar1 = wwCmp2(in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (iVar1 < 1) {
      in_stack_ffffffffffffff10 = b_03 + local_40;
      in_stack_ffffffffffffff18 = local_48 - local_40;
      wVar5 = zzSub2(b_03,b_02,local_40);
      zzSubW2(in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,wVar5);
      wVar5 = zzAdd2(a_00,in_RSI,sVar4);
      if ((wVar5 != 0) || (iVar1 = wwCmp(a_00,b_01,sVar4), -1 < iVar1)) {
        zzSub2(a_00,b_01,sVar4);
      }
      wVar5 = zzAdd2(a_01,in_RDX,sVar3);
      if ((wVar5 != 0) || (iVar1 = wwCmp(a_01,b_00,sVar3), -1 < iVar1)) {
        zzSub2(a_01,b_00,sVar3);
      }
    }
    else {
      in_stack_ffffffffffffff20 = b_02 + local_48;
      in_stack_ffffffffffffff28 = (word *)(local_40 - local_48);
      wVar5 = zzSub2(b_02,b_03,local_48);
      zzSubW2(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff28,wVar5);
      wVar5 = zzAdd2(in_RSI,a_00,sVar4);
      if ((wVar5 != 0) || (iVar1 = wwCmp(in_RSI,b_01,sVar4), -1 < iVar1)) {
        zzSub2(in_RSI,b_01,sVar4);
      }
      wVar5 = zzAdd2(in_RDX,a_01,sVar3);
      if ((wVar5 != 0) || (iVar1 = wwCmp(in_RDX,b_00,sVar3), -1 < iVar1)) {
        zzSub2(in_RDX,b_00,sVar3);
      }
    }
    bVar2 = wwIsZero(b_03,local_48);
  } while (bVar2 == 0);
  wwCopy(in_RDI,b_02,local_40);
  wwBitSize(in_stack_ffffffffffffff10,(size_t)in_RDI);
  wwShHi(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void zzExGCD(word d[], word da[], word db[], const word a[], size_t n,
	const word b[], size_t m, void* stack)
{
	register size_t s;
	register size_t nu, mv;
	// переменные в stack
	word* aa = (word*)stack;
	word* bb = aa + n;
	word* u = bb + m;
	word* v = u + n;
	word* da1 = v + m;
	word* db1 = da1 + m;
	stack = db1 + n;
	// pre
	ASSERT(wwIsDisjoint3(da, m, db, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(a, n, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(b, m, d, MIN2(n, m)));
	ASSERT(wwIsDisjoint2(a, n, da, m));
	ASSERT(wwIsDisjoint2(b, m, da, m));
	ASSERT(wwIsDisjoint2(a, n, db, n));
	ASSERT(wwIsDisjoint2(b, m, db, n));
	ASSERT(!wwIsZero(a, n) && !wwIsZero(b, m));
	// d <- 0, da <- 1, db <- 0, da1 <- 0, db1 <- 1
	wwSetZero(d, MIN2(n, m));
	wwSetW(da, m, 1);
	wwSetZero(db, n);
	wwSetZero(da1, m);
	wwSetW(db1, n, 1);
	// найти максимальное s т.ч. 2^s | a и 2^s | b
	s = utilMin(2, wwLoZeroBits(a, n), wwLoZeroBits(b, m));
	// aa <- a / 2^s, bb <- b / 2^s
	wwCopy(aa, a, n), wwShLo(aa, n, s), n = wwWordSize(aa, n);
	wwCopy(bb, b, m), wwShLo(bb, m, s), m = wwWordSize(bb, m);
	// u <- aa, v <- bb
	wwCopy(u, aa, n);
	wwCopy(v, bb, m);
	nu = n, mv = m;
	// итерации
	do
	{
		// пока u четное
		for (; u[0] % 2 == 0; wwShLo(u, nu, 1))
			if (da[0] % 2 == 0 && db[0] % 2 == 0)
			{
				// da <- da / 2, db <- db / 2
				wwShLo(da, m, 1);
				wwShLo(db, n, 1);
			}
			else
			{
				ASSERT((da[0] + bb[0]) % 2 == 0);
				ASSERT((db[0] + aa[0]) % 2 == 0);
				// da <- (da + bb) / 2, db <- (db0 + aa) / 2
				wwShLoCarry(da, m, 1, zzAdd2(da, bb, m));
				wwShLoCarry(db, n, 1, zzAdd2(db, aa, n));
			}
		// пока v четное
		for (; v[0] % 2 == 0; wwShLo(v, mv, 1))
			if (da1[0] % 2 == 0 && db1[0] % 2 == 0)
			{
				// da1 <- da1 / 2, db1 <- db1 / 2
				wwShLo(da1, m, 1);
				wwShLo(db1, n, 1);
			}
			else
			{
				ASSERT((da1[0] + bb[0]) % 2 == 0);
				ASSERT((db1[0] + aa[0]) % 2 == 0);
				// da1 <- (da1 + bb) / 2, db1 <- (db1 + aa) / 2
				wwShLoCarry(da1, m, 1, zzAdd2(da1, bb, m));
				wwShLoCarry(db1, n, 1, zzAdd2(db1, aa, n));
			}
		// нормализация
		nu = wwWordSize(u, nu);
		mv = wwWordSize(v, mv);
		// u > v?
		if (wwCmp2(u, nu, v, mv) > 0)
		{
			// u <- u - v
			zzSubW2(u + mv, nu - mv, zzSub2(u, v, mv));
			if (zzAdd2(da, da1, m) || wwCmp(da, bb, m) >= 0)
				zzSub2(da, bb, m);
			if (zzAdd2(db, db1, n) || wwCmp(db, aa, n) >= 0)
				zzSub2(db, aa, n);
		}
		else
		{
			// v <- v - u
			zzSubW2(v + nu, mv - nu, zzSub2(v, u, nu));
			if (zzAdd2(da1, da, m) || wwCmp(da1, bb, m) >= 0)
				zzSub2(da1, bb, m);
			if (zzAdd2(db1, db, n) || wwCmp(db1, aa, n) >= 0)
				zzSub2(db1, aa, n);
		}
	} while (!wwIsZero(v, mv));
	// d <- u
	wwCopy(d, u, nu);
	// d <- d * 2^s
	wwShHi(d, W_OF_B(wwBitSize(d, nu) + s), s);
	// очистка
	s = nu = mv = 0;
}